

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool ON_RTree::Search(ON_RTree *a_rtreeA,ON_RTree *a_rtreeB,double tolerance,
                     _func_void_void_ptr_ON__INT_PTR_ON__INT_PTR *resultCallback,void *a_context)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ON_RTreePairSearchCallbackResult r;
  ON_RTreePairSearchCallbackResult local_40;
  
  bVar2 = a_rtreeA->m_root != (ON_RTreeNode *)0x0;
  bVar3 = a_rtreeB->m_root != (ON_RTreeNode *)0x0;
  if (bVar3 && bVar2) {
    bVar1 = ON_IsValid(tolerance);
    local_40.m_tolerance = tolerance;
    if (!bVar1) {
      local_40.m_tolerance = 0.0;
    }
    local_40.m_tolerance = (double)(-(ulong)(0.0 < tolerance) & (ulong)local_40.m_tolerance);
    local_40.m_context = a_context;
    local_40.m_resultCallback = resultCallback;
    PairSearchHelper(a_rtreeA->m_root,a_rtreeB->m_root,&local_40);
  }
  return bVar3 && bVar2;
}

Assistant:

bool ON_RTree::Search( 
  const ON_RTree& a_rtreeA,
  const ON_RTree& a_rtreeB, 
  double tolerance,
  void ON_CALLBACK_CDECL resultCallback(void* a_context, ON__INT_PTR a_idA, ON__INT_PTR a_idB),
  void* a_context
  )
{
  if ( 0 == a_rtreeA.m_root )
    return false;
  if ( 0 == a_rtreeB.m_root )
    return false;
  ON_RTreePairSearchCallbackResult r;
  r.m_tolerance = (ON_IsValid(tolerance) && tolerance > 0.0) ? tolerance : 0.0;
  r.m_context = a_context;
  r.m_resultCallback = resultCallback;
  PairSearchHelper(a_rtreeA.m_root,a_rtreeB.m_root,&r);
  return true;
}